

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void PDHG_PrintPDHGParam(CUPDLPwork *w)

{
  uint *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  long lVar4;
  long in_RDI;
  CUPDLPtimers *timers;
  CUPDLPscaling *scaling;
  CUPDLPiterates *iterates;
  CUPDLPresobj *resobj;
  CUPDLPstepsize *stepsize;
  CUPDLPsettings *settings;
  
  if (1 < *(int *)(*(long *)(in_RDI + 8) + 0x38)) {
    puVar1 = *(uint **)(in_RDI + 8);
    puVar2 = *(uint **)(in_RDI + 0x20);
    puVar3 = *(undefined8 **)(in_RDI + 0x10);
    lVar4 = *(long *)(in_RDI + 0x28);
    printf("\n");
    printf("\n");
    printf("--------------------------------------------------\n");
    printf("CUPDHG Parameters:\n");
    printf("--------------------------------------------------\n");
    printf("\n");
    printf("    nIterLim:          %d\n",(ulong)puVar1[0xb]);
    printf("    dTimeLim (sec):    %.2f\n",*(undefined8 *)(puVar1 + 0xc));
    printf("    ifScaling:         %d\n",(ulong)*puVar1);
    printf("    ifRuizScaling:     %d\n",(ulong)*(uint *)(lVar4 + 0x18));
    printf("    ifL2Scaling:       %d\n",(ulong)*(uint *)(lVar4 + 0x1c));
    printf("    ifPcScaling:       %d\n",(ulong)*(uint *)(lVar4 + 0x20));
    printf("    eLineSearchMethod: %d\n",(ulong)*puVar2);
    printf("    dPrimalTol:        %.4e\n",*(undefined8 *)(puVar1 + 4));
    printf("    dDualTol:          %.4e\n",*(undefined8 *)(puVar1 + 6));
    printf("    dGapTol:           %.4e\n",*(undefined8 *)(puVar1 + 8));
    printf("    dFeasTol:          %.4e\n",*puVar3);
    printf("    eRestartMethod:    %d\n",(ulong)puVar1[0x10]);
    printf("    nLogLevel:    %d\n",(ulong)puVar1[0xe]);
    printf("    nLogInterval:    %d\n",(ulong)puVar1[0xf]);
    printf("    iInfNormAbsLocalTermination:    %d\n",(ulong)puVar1[10]);
    printf("\n");
    printf("--------------------------------------------------\n");
    printf("\n");
  }
  return;
}

Assistant:

void PDHG_PrintPDHGParam(CUPDLPwork *w) {
  if (w->settings->nLogLevel < 2) return;
  CUPDLPsettings *settings = w->settings;
  CUPDLPstepsize *stepsize = w->stepsize;
  CUPDLPresobj *resobj = w->resobj;
  CUPDLPiterates *iterates = w->iterates;
  CUPDLPscaling *scaling = w->scaling;
  CUPDLPtimers *timers = w->timers;

  cupdlp_printf("\n");

  cupdlp_printf("\n");
  cupdlp_printf("--------------------------------------------------\n");
  cupdlp_printf("CUPDHG Parameters:\n");
  cupdlp_printf("--------------------------------------------------\n");
  cupdlp_printf("\n");

  cupdlp_printf("    nIterLim:          %d\n", settings->nIterLim);
  cupdlp_printf("    dTimeLim (sec):    %.2f\n", settings->dTimeLim);
  cupdlp_printf("    ifScaling:         %d\n", settings->ifScaling);
  // cupdlp_printf("    iScalingMethod:    %d\n", settings->iScalingMethod);)
  cupdlp_printf("    ifRuizScaling:     %d\n", scaling->ifRuizScaling);
  cupdlp_printf("    ifL2Scaling:       %d\n", scaling->ifL2Scaling);
  cupdlp_printf("    ifPcScaling:       %d\n", scaling->ifPcScaling);
  cupdlp_printf("    eLineSearchMethod: %d\n", stepsize->eLineSearchMethod);
  // cupdlp_printf("    dScalingLimit:     %.4e\n", settings->dScalingLimit);
  cupdlp_printf("    dPrimalTol:        %.4e\n", settings->dPrimalTol);
  cupdlp_printf("    dDualTol:          %.4e\n", settings->dDualTol);
  cupdlp_printf("    dGapTol:           %.4e\n", settings->dGapTol);
  cupdlp_printf("    dFeasTol:          %.4e\n", resobj->dFeasTol);
  cupdlp_printf("    eRestartMethod:    %d\n", settings->eRestartMethod);
  cupdlp_printf("    nLogLevel:    %d\n", settings->nLogLevel);
  cupdlp_printf("    nLogInterval:    %d\n", settings->nLogInterval);
  cupdlp_printf("    iInfNormAbsLocalTermination:    %d\n", settings->iInfNormAbsLocalTermination);
  cupdlp_printf("\n");
  cupdlp_printf("--------------------------------------------------\n");
  cupdlp_printf("\n");
}